

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

int llhttp__after_headers_complete(llhttp_t *parser,char *p,char *endp)

{
  int iVar1;
  llhttp_t *in_RDI;
  bool bVar2;
  int hasBody;
  int local_4;
  
  bVar2 = true;
  if ((in_RDI->flags & 8) == 0) {
    bVar2 = in_RDI->content_length != 0;
  }
  if (((in_RDI->upgrade == '\0') ||
      (((in_RDI->method != '\x05' && ((in_RDI->flags & 0x40) == 0)) && (bVar2)))) &&
     ((in_RDI->type != '\x02' || (in_RDI->status_code != 0x65)))) {
    if ((in_RDI->type == '\x02') && (in_RDI->status_code == 100)) {
      local_4 = 0;
    }
    else if (((in_RDI->flags & 0x40) == 0) &&
            ((in_RDI->type != '\x02' ||
             (((in_RDI->status_code != 0x66 && (in_RDI->status_code != 0x67)) &&
              ((in_RDI->status_code != 0xcc && (in_RDI->status_code != 0x130)))))))) {
      if ((in_RDI->flags & 8) == 0) {
        if ((in_RDI->flags & 0x200) == 0) {
          if ((in_RDI->flags & 0x20) == 0) {
            iVar1 = llhttp_message_needs_eof(in_RDI);
            if (iVar1 == 0) {
              local_4 = 0;
            }
            else {
              local_4 = 4;
            }
          }
          else if (in_RDI->content_length == 0) {
            local_4 = 0;
          }
          else {
            local_4 = 3;
          }
        }
        else if (((in_RDI->type == '\x01') && ((in_RDI->lenient_flags & 2) == 0)) &&
                ((in_RDI->lenient_flags & 8) == 0)) {
          local_4 = 5;
        }
        else {
          local_4 = 4;
        }
      }
      else {
        local_4 = 2;
      }
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int llhttp__after_headers_complete(llhttp_t* parser, const char* p,
                                   const char* endp) {
  int hasBody;

  hasBody = parser->flags & F_CHUNKED || parser->content_length > 0;
  if (
      (parser->upgrade && (parser->method == HTTP_CONNECT ||
                          (parser->flags & F_SKIPBODY) || !hasBody)) ||
      /* See RFC 2616 section 4.4 - 1xx e.g. Continue */
      (parser->type == HTTP_RESPONSE && parser->status_code == 101)
  ) {
    /* Exit, the rest of the message is in a different protocol. */
    return 1;
  }

  if (parser->type == HTTP_RESPONSE && parser->status_code == 100) {
    /* No body, restart as the message is complete */
    return 0;
  }

  /* See RFC 2616 section 4.4 */
  if (
    parser->flags & F_SKIPBODY ||         /* response to a HEAD request */
    (
      parser->type == HTTP_RESPONSE && (
        parser->status_code == 102 ||     /* Processing */
        parser->status_code == 103 ||     /* Early Hints */
        parser->status_code == 204 ||     /* No Content */
        parser->status_code == 304        /* Not Modified */
      )
    )
  ) {
    return 0;
  } else if (parser->flags & F_CHUNKED) {
    /* chunked encoding - ignore Content-Length header, prepare for a chunk */
    return 2;
  } else if (parser->flags & F_TRANSFER_ENCODING) {
    if (parser->type == HTTP_REQUEST &&
        (parser->lenient_flags & LENIENT_CHUNKED_LENGTH) == 0 &&
        (parser->lenient_flags & LENIENT_TRANSFER_ENCODING) == 0) {
      /* RFC 7230 3.3.3 */

      /* If a Transfer-Encoding header field
       * is present in a request and the chunked transfer coding is not
       * the final encoding, the message body length cannot be determined
       * reliably; the server MUST respond with the 400 (Bad Request)
       * status code and then close the connection.
       */
      return 5;
    } else {
      /* RFC 7230 3.3.3 */

      /* If a Transfer-Encoding header field is present in a response and
       * the chunked transfer coding is not the final encoding, the
       * message body length is determined by reading the connection until
       * it is closed by the server.
       */
      return 4;
    }
  } else {
    if (!(parser->flags & F_CONTENT_LENGTH)) {
      if (!llhttp_message_needs_eof(parser)) {
        /* Assume content-length 0 - read the next */
        return 0;
      } else {
        /* Read body until EOF */
        return 4;
      }
    } else if (parser->content_length == 0) {
      /* Content-Length header given but zero: Content-Length: 0\r\n */
      return 0;
    } else {
      /* Content-Length header given and non-zero */
      return 3;
    }
  }
}